

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O2

string * __thiscall
gl4cts::ShaderSubroutine::APITest2::getVertexShaderBody_abi_cxx11_
          (string *__return_storage_ptr__,APITest2 *this)

{
  allocator<char> local_9;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,
             "#version 400\n\n#extension GL_ARB_shader_subroutine : require\n\nsubroutine int ExampleSubroutineType(int example_argument);\n\nsubroutine(ExampleSubroutineType) int subroutine1(int example_argument)\n{\n    return 1;\n}\n\nsubroutine(ExampleSubroutineType) int subroutine2(int example_argument)\n{\n    return 2;\n}\n\nsubroutine uniform ExampleSubroutineType data_provider;\n\nvoid main()\n{\n    gl_Position = vec4(float(data_provider(0)), vec3(1) );\n}\n"
             ,&local_9);
  return __return_storage_ptr__;
}

Assistant:

std::string APITest2::getVertexShaderBody()
{
	return "#version 400\n"
		   "\n"
		   "#extension GL_ARB_shader_subroutine : require\n"
		   "\n"
		   "subroutine int ExampleSubroutineType(int example_argument);\n"
		   "\n"
		   "subroutine(ExampleSubroutineType) int subroutine1(int example_argument)\n"
		   "{\n"
		   "    return 1;\n"
		   "}\n"
		   "\n"
		   "subroutine(ExampleSubroutineType) int subroutine2(int example_argument)\n"
		   "{\n"
		   "    return 2;\n"
		   "}\n"
		   "\n"
		   "subroutine uniform ExampleSubroutineType data_provider;\n"
		   "\n"
		   "void main()\n"
		   "{\n"
		   "    gl_Position = vec4(float(data_provider(0)), vec3(1) );\n"
		   "}\n";
}